

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O2

void __thiscall
cmCommandArgumentParserHelper::~cmCommandArgumentParserHelper(cmCommandArgumentParserHelper *this)

{
  std::
  vector<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
  ::clear(&this->Variables);
  std::__cxx11::string::~string((string *)&this->ErrorString);
  std::__cxx11::string::~string((string *)&this->Result);
  std::
  vector<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
  ::~vector(&this->Variables);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->OutputBuffer).super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

cmCommandArgumentParserHelper::~cmCommandArgumentParserHelper()
{
  this->CleanupParser();
}